

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O3

ModelWire * __thiscall
lsim::gui::CircuitEditor::ui_try_merge_wire_segment(CircuitEditor *this,ModelWireSegment *segment)

{
  ModelWire *this_00;
  bool bVar1;
  ModelWireJunction *pMVar2;
  long lVar3;
  Point *p;
  ModelWire *pMVar4;
  ModelWire *pMVar5;
  ModelWire *pMVar6;
  _Hash_node_base *p_Var7;
  Point end_points [2];
  ModelWire *target_wires [2];
  Point local_58;
  Point local_50;
  ModelWire *local_48;
  ModelWire *pMStack_40;
  CircuitEditor *local_38;
  
  local_48 = (ModelWire *)0x0;
  pMStack_40 = (ModelWire *)0x0;
  pMVar5 = (ModelWire *)0x0;
  pMVar2 = ModelWireSegment::junction(segment,0);
  local_58 = pMVar2->m_position;
  lVar3 = 1;
  pMVar2 = ModelWireSegment::junction(segment,1);
  local_50 = pMVar2->m_position;
  p_Var7 = (this->m_model_circuit->m_wires)._M_h._M_before_begin._M_nxt;
  if (p_Var7 != (_Hash_node_base *)0x0) {
    pMVar4 = (ModelWire *)0x0;
    pMVar5 = (ModelWire *)0x0;
    local_38 = this;
    do {
      this_00 = (ModelWire *)p_Var7[2]._M_nxt;
      if (this_00->m_id < segment->m_wire->m_id) {
        if ((pMVar5 == (ModelWire *)0x0) &&
           (bVar1 = ModelWire::point_on_wire(this_00,&local_58), p = &local_58, pMVar6 = this_00,
           bVar1)) {
LAB_001519ad:
          ModelWire::split_at_new_junction(this_00,p);
          pMVar5 = pMVar6;
        }
        else if (pMVar4 == (ModelWire *)0x0) {
          bVar1 = ModelWire::point_on_wire(this_00,&local_50);
          p = &local_50;
          pMVar4 = this_00;
          pMVar6 = pMVar5;
          if (!bVar1) {
            pMVar4 = (ModelWire *)0x0;
            goto LAB_001519c5;
          }
          goto LAB_001519ad;
        }
        if (pMVar5 != (ModelWire *)0x0 && pMVar4 != (ModelWire *)0x0) break;
      }
LAB_001519c5:
      p_Var7 = p_Var7->_M_nxt;
    } while (p_Var7 != (_Hash_node_base *)0x0);
    pMStack_40 = pMVar4;
    this = local_38;
  }
  local_48 = pMVar5;
  pMVar5 = segment->m_wire;
  bVar1 = false;
  do {
    lVar3 = lVar3 + -1;
    while ((&pMStack_40)[lVar3] == (ModelWire *)0x0) {
      lVar3 = lVar3 + -1;
      if (lVar3 == -2) {
        if (bVar1) {
          return pMVar5;
        }
        return segment->m_wire;
      }
    }
    ModelWire::merge((&pMStack_40)[lVar3],pMVar5);
    ModelCircuit::remove_wire(this->m_model_circuit,pMVar5->m_id);
    pMVar5 = (&pMStack_40)[lVar3];
    bVar1 = true;
  } while (lVar3 != -1);
  return pMVar5;
}

Assistant:

ModelWire* CircuitEditor::ui_try_merge_wire_segment(ModelWireSegment* segment) {

	ModelWire* target_wires[2] = { nullptr, nullptr };
	Point end_points[2] = { segment->junction(0)->position(), segment->junction(1)->position() };

	for (auto& iter : m_model_circuit->wires()) {
		auto wire = iter.second.get();
		if (wire->id() >= segment->wire()->id()) {
			continue;
		}
			
		if (target_wires[0] == nullptr && wire->point_on_wire(end_points[0])) {
			wire->split_at_new_junction(end_points[0]);
			target_wires[0] = wire;
		} else if (target_wires[1] == nullptr && wire->point_on_wire(end_points[1])) {
			wire->split_at_new_junction(end_points[1]);
			target_wires[1] = wire;
		}

		if (target_wires[0] != nullptr && target_wires[1] != nullptr) {
			break;
		}
	}

	auto wire_to_merge = segment->wire();
	bool merged = false;
	for (int w = 1; w >= 0; --w) {
		if (target_wires[w] != nullptr) {
			target_wires[w]->merge(wire_to_merge);
			m_model_circuit->remove_wire(wire_to_merge->id());
			wire_to_merge = target_wires[w];
			merged = true;
		}
	}

	return (merged) ? wire_to_merge : segment->wire();
}